

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O3

void replay_init_worker(__cilkrts_worker *w,global_state_t *g)

{
  ushort uVar1;
  uint uVar2;
  replay_entry_t *prVar3;
  int iVar4;
  int iVar5;
  ped_type_t pVar6;
  record_replay_t rVar7;
  FILE *pFVar8;
  char *pcVar9;
  replay_entry_t *prVar10;
  long lVar11;
  replay_entry_t *prVar12;
  int32_t i2;
  int32_t i1;
  char ped_type [16];
  char worker_file_name [512];
  uint local_658;
  uint local_654;
  __cilkrts_worker *local_650;
  long local_648 [2];
  undefined4 local_638;
  undefined3 uStack_634;
  char local_238 [520];
  
  rVar7 = g->record_or_replay;
  if (rVar7 == RECORD_REPLAY_NONE) {
    return;
  }
  if (rVar7 == REPLAY_LOG) {
    local_654 = 0xffffffff;
    local_658 = 0xffffffff;
    snprintf_s_si(local_238,0x200,"%s%d.cilklog",w->g->record_replay_file_name,w->self);
    pFVar8 = fopen(local_238,"r");
    if (pFVar8 == (FILE *)0x0) {
LAB_0010c4f2:
      replay_init_worker_cold_4();
    }
    else {
      iVar4 = feof(pFVar8);
      lVar11 = 1;
      if (iVar4 == 0) {
        iVar4 = 1;
        local_650 = w;
        do {
          pcVar9 = fgets((char *)&local_638,0x400,pFVar8);
          if (pcVar9 != (char *)0x0) {
            iVar4 = iVar4 + (uint)(CONCAT31(uStack_634,local_638._3_1_) != 0x7372656b ||
                                  local_638 != 0x6b726f57);
          }
          iVar5 = feof(pFVar8);
        } while (iVar5 == 0);
        lVar11 = (long)iVar4;
        w = local_650;
      }
      prVar10 = (replay_entry_t *)__cilkrts_malloc(lVar11 * 0x10);
      w->l->replay_list_root = prVar10;
      prVar10[lVar11 + -1].m_type = ped_type_last;
      rewind(pFVar8);
      prVar10 = w->l->replay_list_root;
      iVar4 = feof(pFVar8);
      if (iVar4 == 0) {
        do {
          iVar4 = __isoc99_fscanf(pFVar8,"%s %s %d %d\n",local_648,&local_638,&local_654,&local_658)
          ;
          if (iVar4 == -1) break;
          if (iVar4 != 4) goto LAB_0010c501;
          if (local_648[0] == 0x7372656b726f57) {
            uVar2 = w->g->P;
            if (local_654 != uVar2) {
              cilkos_error("Cannot continue replay: number of workers(%d) doesn\'t match that from the recording(%d).\n"
                           ,(ulong)uVar2,(ulong)local_654);
            }
            if (local_658 != 1) {
              cilkos_error("Pedigree file version %d doesn\'t match current version %d - cannot continue.\n"
                           ,(ulong)local_658,1);
            }
          }
          else {
            replay_entry_t::load(prVar10,(char *)local_648,(char *)&local_638,local_654,local_658);
            prVar10 = prVar10 + 1;
          }
          iVar4 = feof(pFVar8);
        } while (iVar4 == 0);
      }
      if (prVar10->m_type == ped_type_last) {
        w->l->replay_list_entry = w->l->replay_list_root;
        fclose(pFVar8);
        prVar10 = w->l->replay_list_root;
        while( true ) {
          if (prVar10->m_type == ped_type_steal) {
            uVar1 = prVar10->m_value;
            if (((short)uVar1 < 0) || (g->total_workers <= (int)(short)uVar1)) {
              replay_init_worker_cold_2();
            }
            else {
              prVar12 = g->workers[uVar1]->l->replay_list_root;
              if (prVar12 != (replay_entry_t *)0x0) {
                pVar6 = prVar12->m_type;
                while (pVar6 != ped_type_last) {
                  if (((pVar6 == ped_type_orphaned) &&
                      (prVar10->m_pedigree_len == prVar12->m_pedigree_len)) &&
                     (iVar4 = bcmp(prVar10->m_reverse_pedigree,prVar12->m_reverse_pedigree,
                                   (long)prVar10->m_pedigree_len << 3), iVar4 == 0)) {
                    prVar12->m_value = 0;
                    break;
                  }
                  prVar3 = prVar12 + 1;
                  prVar12 = prVar12 + 1;
                  pVar6 = prVar3->m_type;
                }
                goto LAB_0010c310;
              }
            }
            replay_init_worker_cold_3();
            goto LAB_0010c4f2;
          }
          if (prVar10->m_type == ped_type_last) break;
LAB_0010c310:
          prVar10 = prVar10 + 1;
        }
        rVar7 = g->record_or_replay;
        goto LAB_0010c39b;
      }
    }
    replay_init_worker_cold_1();
LAB_0010c4fc:
    replay_init_worker_cold_5();
LAB_0010c501:
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/record-replay.cpp"
                  ,0x242,"4 == fret");
  }
LAB_0010c39b:
  if (rVar7 == RECORD_LOG) {
    snprintf_s_si((char *)&local_638,0x200,"%s%d.cilklog",g->record_replay_file_name,w->self);
    pFVar8 = fopen((char *)&local_638,"w+");
    w->l->record_replay_fptr = (FILE *)pFVar8;
    if (pFVar8 == (FILE *)0x0) goto LAB_0010c4fc;
    if (w->self == 0) {
      write_to_replay_log(w,"Workers",(__cilkrts_pedigree *)0x0,g->P,1);
    }
  }
  return;
}

Assistant:

void replay_init_worker(__cilkrts_worker* w, global_state_t *g)
{
    char worker_file_name[512];

    // If we're not recording or replaying a log, we're done.  All of the
    // fields in the global_state_t or local_state_t are already initialized
    // to default values.
    if (RECORD_REPLAY_NONE == g->record_or_replay)
        return;

    // If we're replaying a log, read worker's log and construct the
    // in-memory log
    if (REPLAY_LOG == g->record_or_replay)
    {
        // This function will also initialize and fill the worker's
        // replay list
        load_recorded_log(w);

        // Scan for orphans with no matching steal.  Mark them so they'll be
        // skipped as we advance through the log.
        scan_for_matching_steals(g, w->l->replay_list_root);

        // If we're recording the logs while replaying, create the log files.
        // This will only be used for debugging.  Create the logs in the
        // current directory.  It should be as good a place as any...
#if RECORD_ON_REPLAY
        cilk_snprintf_i(worker_file_name, sizeof(worker_file_name),
                        "replay_log_%d.cilklog",  w->self);
        w->l->record_replay_fptr = fopen(worker_file_name, "w+");
        CILK_ASSERT(NULL != w->l->record_replay_fptr);

        // Record the number of workers, file version in Worker 0's file
        if (w->self == 0) {
            write_to_replay_log (w, PED_TYPE_STR_WORKERS, NULL, g->P, PED_VERSION);
        }
#endif // RECORD_ON_REPLAY
    }

    // If we're recording, create the log files
    if (RECORD_LOG == g->record_or_replay)
    {
        cilk_snprintf_si(worker_file_name, sizeof(worker_file_name),
                         "%s%d.cilklog", g->record_replay_file_name, w->self);
        w->l->record_replay_fptr = fopen(worker_file_name, "w+");
        CILK_ASSERT(NULL != w->l->record_replay_fptr);

        // Record the number of workers, file version in Worker 0's file
        if (w->self == 0) {
            write_to_replay_log(w, PED_TYPE_STR_WORKERS, NULL, g->P, PED_VERSION);
        }
    }
}